

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::processingQualifier(CScanner *this,char c)

{
  bool bVar1;
  char c_local;
  CScanner *this_local;
  
  bVar1 = IsWordLetter(c);
  if (bVar1) {
    std::__cxx11::string::operator+=
              ((string *)
               &(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                super_CQualifierParser.token.word,c);
  }
  else if (c == ':') {
    addToken(this,TT_Qualifier);
    this->state = S_Initial;
  }
  else {
    error(this,E_UnclosedQualifier,c);
    this->state = S_Initial;
    processing(this,c);
  }
  return;
}

Assistant:

void CScanner::processingQualifier( char c )
{
	if( IsWordLetter( c ) ) {
		token.word += c;
	} else if( c == LimiterOfQualifier ) {
		addToken( TT_Qualifier );
		state = S_Initial;
	} else {
		error( E_UnclosedQualifier, c );
		state = S_Initial;
		processing( c );
	}
}